

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

int xmlPopOutputCallbacks(void)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = -1;
  if ((xmlOutputCallbackInitialized == '\x01') && (0 < (long)xmlOutputCallbackNr)) {
    uVar2 = (long)xmlOutputCallbackNr - 1;
    iVar1 = (int)uVar2;
    xmlOutputCallbackNr = iVar1;
    xmlOutputCallbackTable[uVar2 & 0xffffffff].matchcallback = (xmlOutputMatchCallback)0x0;
    xmlOutputCallbackTable[uVar2].closecallback = (xmlOutputCloseCallback)0x0;
    xmlOutputCallbackTable[uVar2].opencallback = (xmlOutputOpenCallback)0x0;
    xmlOutputCallbackTable[uVar2].writecallback = (xmlOutputWriteCallback)0x0;
  }
  return iVar1;
}

Assistant:

int
xmlPopOutputCallbacks(void)
{
    if (!xmlOutputCallbackInitialized)
        return(-1);

    if (xmlOutputCallbackNr <= 0)
        return(-1);

    xmlOutputCallbackNr--;
    xmlOutputCallbackTable[xmlOutputCallbackNr].matchcallback = NULL;
    xmlOutputCallbackTable[xmlOutputCallbackNr].opencallback = NULL;
    xmlOutputCallbackTable[xmlOutputCallbackNr].writecallback = NULL;
    xmlOutputCallbackTable[xmlOutputCallbackNr].closecallback = NULL;

    return(xmlOutputCallbackNr);
}